

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O1

Name __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::removeAt
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t index)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  undefined8 uVar5;
  size_t size;
  long lVar6;
  Name NVar7;
  
  if (this->usedElements <= index) {
    __assert_fail("index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                  ,0x17d,
                  "T ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::removeAt(size_t) [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
                 );
  }
  lVar6 = index * 0x10;
  sVar3 = this->data[index].super_IString.str._M_len;
  pcVar4 = this->data[index].super_IString.str._M_str;
  size = this->usedElements - 1;
  if (index < size) {
    do {
      index = index + 1;
      puVar1 = (undefined8 *)((long)&this->data[1].super_IString.str._M_len + lVar6);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(this->data->super_IString).str._M_len + lVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      size = this->usedElements - 1;
      lVar6 = lVar6 + 0x10;
    } while (index < size);
  }
  resize(this,size);
  NVar7.super_IString.str._M_str = pcVar4;
  NVar7.super_IString.str._M_len = sVar3;
  return (Name)NVar7.super_IString.str;
}

Assistant:

T removeAt(size_t index) {
    assert(index < size());
    auto item = data[index];
    for (auto i = index; i < size() - 1; ++i) {
      data[i] = data[i + 1];
    }
    resize(size() - 1);
    return item;
  }